

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_released(RELEASED_HANDLE released)

{
  RELEASED_INSTANCE *released_instance;
  AMQP_VALUE result;
  RELEASED_HANDLE released_local;
  
  if (released == (RELEASED_HANDLE)0x0) {
    released_instance = (RELEASED_INSTANCE *)0x0;
  }
  else {
    released_instance = (RELEASED_INSTANCE *)amqpvalue_clone(released->composite_value);
  }
  return (AMQP_VALUE)released_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_released(RELEASED_HANDLE released)
{
    AMQP_VALUE result;

    if (released == NULL)
    {
        result = NULL;
    }
    else
    {
        RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)released;
        result = amqpvalue_clone(released_instance->composite_value);
    }

    return result;
}